

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

cmInstalledFile * __thiscall cmake::GetInstalledFile(cmake *this,string *name)

{
  bool bVar1;
  pointer ppVar2;
  cmInstalledFile *file;
  _Self local_28;
  const_iterator i;
  string *name_local;
  cmake *this_local;
  
  i._M_node = (_Base_ptr)name;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
       ::find(&this->InstalledFiles,name);
  file = (cmInstalledFile *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
         ::end(&this->InstalledFiles);
  bVar1 = std::operator!=(&local_28,(_Self *)&file);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>
             ::operator->(&local_28);
    this_local = (cmake *)&ppVar2->second;
  }
  else {
    this_local = (cmake *)0x0;
  }
  return (cmInstalledFile *)this_local;
}

Assistant:

cmInstalledFile const* cmake::GetInstalledFile(const std::string& name) const
{
  std::map<std::string, cmInstalledFile>::const_iterator i =
    this->InstalledFiles.find(name);

  if (i != this->InstalledFiles.end()) {
    cmInstalledFile const& file = i->second;
    return &file;
  }
  return CM_NULLPTR;
}